

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpegStreamReader.cpp
# Opt level: O0

int __thiscall MPEGStreamReader::flushPacket(MPEGStreamReader *this,AVPacket *avPacket)

{
  uint8_t *puVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int64_t iVar5;
  int iVar6;
  undefined4 extraout_var;
  ostream *this_00;
  string local_80;
  allocator<char> local_49;
  string local_48 [8];
  string message;
  int decodeRez;
  int isNal;
  uint8_t *prevPos;
  AVPacket *avPacket_local;
  MPEGStreamReader *this_local;
  
  this->m_eof = true;
  avPacket->codec = (BaseAbstractStreamReader *)this;
  avPacket->duration = 0;
  avPacket->data = (uint8_t *)0x0;
  avPacket->size = 0;
  avPacket->flags = (this->super_AbstractStreamReader).m_flags;
  avPacket->stream_index = (this->super_AbstractStreamReader).m_streamIndex;
  iVar6 = (*(this->super_AbstractStreamReader).super_BaseAbstractStreamReader.
            _vptr_BaseAbstractStreamReader[0xd])();
  avPacket->codecID = *(int *)CONCAT44(extraout_var,iVar6);
  if (0 < (this->super_AbstractStreamReader).m_tmpBufferLen) {
    puVar1 = (this->super_AbstractStreamReader).m_curPos;
    (this->super_AbstractStreamReader).m_curPos = this->m_tmpBuffer;
    (this->super_AbstractStreamReader).m_bufEnd =
         this->m_tmpBuffer + (this->super_AbstractStreamReader).m_tmpBufferLen;
    message.field_2._12_4_ = bufFromNAL(this);
    message.field_2._8_4_ = 0;
    if ((message.field_2._12_4_ != 0) &&
       (this->m_shortStartCodes = (int)message.field_2._12_4_ < 4,
       this->m_lastDecodedPos < puVar1 + (int)message.field_2._12_4_)) {
      this->m_lastDecodedPos = (uint8_t *)0x0;
      message.field_2._8_4_ =
           (*(this->super_AbstractStreamReader).super_BaseAbstractStreamReader.
             _vptr_BaseAbstractStreamReader[0x1f])
                     (this,(this->super_AbstractStreamReader).m_curPos + (int)message.field_2._12_4_
                     );
    }
    if (message.field_2._8_4_ == 0) {
      avPacket->data = this->m_tmpBuffer;
      avPacket->size = (int32_t)(this->super_AbstractStreamReader).m_tmpBufferLen;
    }
  }
  avPacket->pts = this->m_curPts + (this->super_AbstractStreamReader).m_timeOffset;
  lVar2 = this->m_curDts;
  lVar3 = (this->super_AbstractStreamReader).m_timeOffset;
  lVar4 = this->m_pcrIncPerFrame;
  iVar6 = (*(this->super_AbstractStreamReader).super_BaseAbstractStreamReader.
            _vptr_BaseAbstractStreamReader[0x17])();
  avPacket->dts = (lVar2 + lVar3) - lVar4 * iVar6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_48,"Processed ",&local_49);
  std::allocator<char>::~allocator(&local_49);
  int32ToStr_abi_cxx11_(&local_80,&this->m_totalFrameNum);
  std::__cxx11::string::operator+=(local_48,(string *)&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::operator+=(local_48," video frames");
  this_00 = std::operator<<((ostream *)&std::cout,local_48);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  sLastMsg = true;
  this->m_processedBytes = (long)avPacket->size + this->m_processedBytes;
  iVar5 = (this->super_AbstractStreamReader).m_tmpBufferLen;
  std::__cxx11::string::~string(local_48);
  return (int)iVar5;
}

Assistant:

int MPEGStreamReader::flushPacket(AVPacket& avPacket)
{
    m_eof = true;
    avPacket.codec = this;
    avPacket.duration = 0;
    avPacket.data = nullptr;
    avPacket.size = 0;
    avPacket.flags = m_flags;
    avPacket.stream_index = m_streamIndex;
    avPacket.codecID = getCodecInfo().codecID;

    if (m_tmpBufferLen > 0)
    {
        const uint8_t* prevPos = m_curPos;
        m_curPos = m_tmpBuffer;
        m_bufEnd = m_tmpBuffer + m_tmpBufferLen;
        const int isNal = bufFromNAL();
        int decodeRez = 0;
        if (isNal)
        {
            m_shortStartCodes = isNal < 4;
            if ((prevPos + isNal) > m_lastDecodedPos)
            {
                m_lastDecodedPos = nullptr;
                decodeRez = decodeNal(m_curPos + isNal);
            }
        }
        if (decodeRez == 0)
        {
            avPacket.data = m_tmpBuffer;
            avPacket.size = static_cast<int>(m_tmpBufferLen);
        }
    }

    avPacket.pts = m_curPts + m_timeOffset;
    avPacket.dts = m_curDts + m_timeOffset - m_pcrIncPerFrame * getFrameDepth();  // shift dts back

    string message = "Processed ";
    message += int32ToStr(m_totalFrameNum);
    message += " video frames";
    LTRACE(LT_DEBUG, 0, message);
    LTRACE(LT_INFO, 2, message);
    m_processedBytes += avPacket.size;
    return static_cast<int>(m_tmpBufferLen);
}